

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executable.cpp
# Opt level: O0

void __thiscall
Executable::Executable(Executable *this,AbstractByteBuffer *v_buf,exe_bits v_bitMode)

{
  ExeException *this_00;
  QString local_38;
  exe_bits local_1c;
  AbstractByteBuffer *pAStack_18;
  exe_bits v_bitMode_local;
  AbstractByteBuffer *v_buf_local;
  Executable *this_local;
  
  local_1c = v_bitMode;
  pAStack_18 = v_buf;
  v_buf_local = &this->super_AbstractByteBuffer;
  AbstractByteBuffer::AbstractByteBuffer(&this->super_AbstractByteBuffer);
  (this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__Executable_0018d748;
  this->bitMode = local_1c;
  this->buf = pAStack_18;
  if (pAStack_18 == (AbstractByteBuffer *)0x0) {
    this_00 = (ExeException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_38,"Cannot make an Exe from NULL buffer");
    ExeException::ExeException(this_00,&local_38);
    __cxa_throw(this_00,&ExeException::typeinfo,ExeException::~ExeException);
  }
  return;
}

Assistant:

Executable::Executable(AbstractByteBuffer *v_buf, exe_bits v_bitMode)
    : buf(v_buf), bitMode(v_bitMode)
{
    if (!v_buf) throw ExeException("Cannot make an Exe from NULL buffer");
}